

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStream_EndProcessing(PaAlsaStream *self,unsigned_long numFrames,int *xrunOccurred)

{
  snd_pcm_channel_area_t *psVar1;
  snd_pcm_uframes_t sVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  void *pvVar7;
  byte bVar8;
  ulong uVar9;
  char *format;
  uint uVar10;
  void *__s;
  int xrun;
  int local_50;
  int local_4c;
  int *local_48;
  undefined8 local_40;
  unsigned_long local_38;
  
  local_50 = 0;
  if (((self->capture).pcm != (snd_pcm_t *)0x0) &&
     (paUtilErr_ = PaAlsaStreamComponent_EndProcessing(&self->capture,numFrames,&local_50),
     paUtilErr_ < 0)) {
    format = 
    "Expression \'PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3656\n"
    ;
LAB_001131f8:
    PaUtil_DebugPrint(format);
  }
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    uVar10 = (self->playback).numHostChannels;
    iVar3 = (self->playback).numUserChannels;
    if (iVar3 < (int)uVar10) {
      if ((self->playback).streamDir != StreamDirection_Out) {
        __assert_fail("StreamDirection_Out == self->streamDir",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xe09,
                      "PaError PaAlsaStreamComponent_DoChannelAdaption(PaAlsaStreamComponent *, PaUtilBufferProcessor *, int)"
                     );
      }
      iVar6 = uVar10 - iVar3;
      bVar8 = (uVar10 & 1) == 0 & (byte)iVar3;
      local_48 = xrunOccurred;
      if ((self->playback).hostInterleaved == 0) {
        if (bVar8 != 0) {
          psVar1 = (self->playback).channelAreas;
          sVar2 = (self->playback).offset;
          iVar3 = snd_pcm_area_copy(psVar1 + iVar3,sVar2,psVar1 + (long)iVar3 + -1,sVar2,
                                    numFrames & 0xffffffff,(self->playback).nativeFormat);
          if (iVar3 < 0) {
            PaAlsaStream_EndProcessing_cold_1();
            format = 
            "Expression \'PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3662\n"
            ;
            goto LAB_001131f8;
          }
          iVar6 = iVar6 + -1;
        }
        if (0 < iVar6) {
          snd_pcm_areas_silence
                    ((self->playback).channelAreas +
                     ((long)(self->playback).numHostChannels - (long)iVar6),(self->playback).offset,
                     iVar6,(long)(int)numFrames,(self->playback).nativeFormat);
        }
      }
      else {
        local_4c = iVar6;
        uVar5 = snd_pcm_format_size((self->playback).nativeFormat);
        if ((self->playback).canMmap == 0) {
          pvVar7 = (self->playback).nonMmapBuffer;
        }
        else {
          psVar1 = (self->playback).channelAreas;
          pvVar7 = (void *)(((ulong)psVar1->step * (self->playback).offset + (ulong)psVar1->first >>
                            3) + (long)psVar1->addr);
        }
        iVar3 = (self->playback).numUserChannels;
        iVar4 = (int)uVar5;
        __s = (void *)((long)(iVar3 * iVar4) + (long)pvVar7);
        iVar6 = local_4c;
        if (bVar8 != 0) {
          if (0 < (int)numFrames) {
            pvVar7 = (void *)((long)pvVar7 + (long)((iVar3 + -1) * iVar4));
            uVar9 = numFrames & 0xffffffff;
            local_40 = uVar5;
            local_38 = numFrames;
            do {
              memcpy((void *)((long)pvVar7 + (long)iVar4),pvVar7,(long)iVar4);
              pvVar7 = (void *)((long)pvVar7 + (long)(self->playback).numHostChannels * (long)iVar4)
              ;
              uVar10 = (int)uVar9 - 1;
              uVar9 = (ulong)uVar10;
              uVar5 = local_40;
              numFrames = local_38;
            } while (uVar10 != 0);
          }
          __s = (void *)((long)__s + (long)iVar4);
          iVar6 = local_4c + -1;
        }
        if ((0 < (int)numFrames) && (0 < iVar6)) {
          uVar9 = numFrames & 0xffffffff;
          do {
            memset(__s,0,(long)(iVar6 * (int)uVar5));
            __s = (void *)((long)__s + (long)(self->playback).numHostChannels * (long)(int)uVar5);
            uVar10 = (int)uVar9 - 1;
            uVar9 = (ulong)uVar10;
          } while (uVar10 != 0);
        }
      }
      paUtilErr_ = 0;
      xrunOccurred = local_48;
    }
    paUtilErr_ = PaAlsaStreamComponent_EndProcessing(&self->playback,numFrames,&local_50);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3664\n"
      ;
      goto LAB_001131f8;
    }
  }
  *xrunOccurred = local_50;
  return 0;
}

Assistant:

static PaError PaAlsaStream_EndProcessing( PaAlsaStream *self, unsigned long numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    int xrun = 0;

    if( self->capture.pcm )
    {
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun ) );
    }
    if( self->playback.pcm )
    {
        if( self->playback.numHostChannels > self->playback.numUserChannels )
        {
            PA_ENSURE( PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames ) );
        }
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun ) );
    }

error:
    *xrunOccurred = xrun;
    return result;
}